

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O2

Slice __thiscall leveldb::anon_unknown_0::MergingIterator::key(MergingIterator *this)

{
  int iVar1;
  Slice SVar2;
  
  iVar1 = (*(this->super_Iterator)._vptr_Iterator[2])();
  if ((char)iVar1 != '\0') {
    SVar2 = IteratorWrapper::key(this->current_);
    return SVar2;
  }
  __assert_fail("Valid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/merger.cc"
                ,0x6f,"virtual Slice leveldb::(anonymous namespace)::MergingIterator::key() const");
}

Assistant:

Slice key() const override {
    assert(Valid());
    return current_->key();
  }